

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
          (list_caster<std::vector<long,_std::allocator<long>_>,_long> *this,handle src,bool convert
          )

{
  pointer plVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  reference it;
  value_conv conv;
  handle local_80;
  handle local_78;
  handle local_70;
  PyObject *local_68;
  long local_60;
  PyObject *local_50;
  long local_48;
  object local_40;
  type_caster<long,_void> local_38;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_80.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_00181148;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_80.m_ptr = src.m_ptr;
    }
    plVar1 = (this->value).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->value).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish != plVar1) {
      (this->value).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = plVar1;
    }
    if (local_80.m_ptr != (PyObject *)0x0) {
      (local_80.m_ptr)->ob_refcnt = (local_80.m_ptr)->ob_refcnt + 1;
    }
    local_70.m_ptr = local_80.m_ptr;
    reserve_maybe<std::vector<long,_std::allocator<long>_>,_0>
              (this,(sequence *)&local_70,&this->value);
    object::~object((object *)&local_70);
    local_68 = local_80.m_ptr;
    sVar5 = sequence::end((sequence *)&local_80);
    local_60 = sVar5.super_sequence_slow_readwrite.index;
    for (lVar4 = 0; bVar2 = local_60 == lVar4, !bVar2; lVar4 = lVar4 + 1) {
      local_50 = local_68;
      local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_48 = lVar4;
      accessor::operator_cast_to_object((accessor *)&local_78);
      bVar3 = type_caster<long,_void>::load(&local_38,local_78,convert);
      object::~object((object *)&local_78);
      if (!bVar3) {
        object::~object(&local_40);
        break;
      }
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&this->value,&local_38.value);
      object::~object(&local_40);
    }
    object::~object((object *)&local_80);
  }
  else {
LAB_00181148:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }